

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

int __thiscall
CVmObjLookupTable::for_each_gen
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,int pass_key_to_cb,
          vm_rcdesc *rc)

{
  int iVar1;
  uint uVar2;
  CVmRun *this_00;
  vm_val_t *this_01;
  vm_lookup_ext *this_02;
  vm_lookup_val *val;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjLookupTable *in_RDI;
  int in_R8D;
  uint i;
  vm_lookup_val *entry;
  vm_val_t *fn;
  CVmNativeCodeDesc *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb4;
  
  if ((for_each_gen(unsigned_int,vm_val_t*,unsigned_int*,int,vm_rcdesc*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&for_each_gen(unsigned_int,vm_val_t*,unsigned_int*,int,vm_rcdesc*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&for_each_gen::desc,1);
    __cxa_guard_release(&for_each_gen(unsigned_int,vm_val_t*,unsigned_int*,int,vm_rcdesc*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (uint *)in_RDI,in_stack_ffffffffffffff98);
  if (iVar1 == 0) {
    this_00 = (CVmRun *)CVmStack::get(0);
    this_01 = CVmStack::push();
    vm_val_t::set_obj(this_01,in_ESI);
    uVar2 = get_entry_count((CVmObjLookupTable *)0x36a794);
    this_02 = get_ext(in_RDI);
    val = vm_lookup_ext::idx_to_val(this_02,0);
    for (; uVar2 != 0; uVar2 = uVar2 - 1) {
      if (((anon_union_8_8_cb74652f_for_val *)&val->key)->obj != 0xd) {
        CVmStack::push(&val->val);
        if (in_R8D != 0) {
          CVmStack::push(&val->key);
        }
        CVmRun::call_func_ptr
                  (this_00,&val->key,in_stack_ffffffffffffffb4,
                   (vm_rcdesc *)CONCAT44(in_stack_ffffffffffffffac,uVar2),
                   (uint)((ulong)in_RDI >> 0x20));
      }
      val = val + 1;
    }
    CVmStack::discard(2);
    vm_val_t::set_nil(in_RDX);
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::for_each_gen(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc,
                                    int pass_key_to_cb, vm_rcdesc *rc)
{
    vm_val_t *fn;
    vm_lookup_val *entry;
    static CVmNativeCodeDesc desc(1);
    uint i;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* the function to invoke is the top argument */
    fn = G_stk->get(0);

    /* push a self-reference for gc protection */
    G_stk->push()->set_obj(self);

    /* iterate over each bucket */
    for (i = get_entry_count(), entry = get_ext()->idx_to_val(0) ;
         i != 0 ; --i, ++entry)
    {
        /* 
         *   if it's in use (i.e., if the key is non-empty), invoke the
         *   callback for the entry 
         */
        if (entry->key.typ != VM_EMPTY)
        {
            /* push the current value argument */
            G_stk->push(&entry->val);

            /* push the key if desired */
            if (pass_key_to_cb)
                G_stk->push(&entry->key);
            
            /* invoke the callback */
            G_interpreter->call_func_ptr(vmg_ fn, pass_key_to_cb ? 2 : 1,
                                         rc, 0);
        }
    }

    /* discard the arguments and gc protection */
    G_stk->discard(2);

    /* no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}